

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O0

void cmdline_cleanup(void)

{
  char *b;
  size_t n;
  int local_c;
  int pri;
  
  b = cmdline_password;
  if (cmdline_password != (char *)0x0) {
    n = strlen(cmdline_password);
    smemclr(b,n);
    safefree(cmdline_password);
    cmdline_password = (char *)0x0;
  }
  for (local_c = 0; local_c < 2; local_c = local_c + 1) {
    safefree(saves[local_c].params);
    saves[local_c].params = (cmdline_saved_param *)0x0;
    saves[local_c].savesize = 0;
    saves[local_c].nsaved = 0;
  }
  return;
}

Assistant:

void cmdline_cleanup(void)
{
    int pri;

    if (cmdline_password) {
        smemclr(cmdline_password, strlen(cmdline_password));
        sfree(cmdline_password);
        cmdline_password = NULL;
    }

    for (pri = 0; pri < NPRIORITIES; pri++) {
        sfree(saves[pri].params);
        saves[pri].params = NULL;
        saves[pri].savesize = 0;
        saves[pri].nsaved = 0;
    }
}